

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atakebune.cpp
# Opt level: O2

void __thiscall Atakebune::Atakebune(Atakebune *this,string *n,int t,int spT)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_88,(string *)n);
  std::operator+(&local_68,"Green Card - Follower. Atakebune: ",n);
  Follower::Follower(&this->super_Follower,&local_88,t,spT,3,2,4,3,3,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  (this->super_Follower).super_GreenCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00116798;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 3;
  this->tapped = false;
  this->attackBonus = 2;
  this->defenseBonus = 4;
  this->minimumHonor = 3;
  this->effectBonus = 3;
  this->effectCost = 4;
  std::operator+(&local_48,"Green Card - Follower. Atakebune: ",&this->name);
  std::__cxx11::string::operator=((string *)&this->cardText,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Atakebune::Atakebune(string n, int t, int spT) : Follower{n, t, spT, 3, 2, 4, 3, 3, 4, "Green Card - Follower. Atakebune: "+ n}
{
    name = n;
    cost = 3;
    tapped = false;

    attackBonus = 2;
    defenseBonus = 4;
    minimumHonor = 3;
    effectBonus = 3;
    effectCost = 4;
    cardText = "Green Card - Follower. Atakebune: " + name;
}